

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O2

void uss_rmdir(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  int iVar1;
  char *__path;
  SftpReplyBuilder *reply_00;
  
  reply_00 = (SftpReplyBuilder *)path.len;
  __path = mkstr(path);
  iVar1 = rmdir(__path);
  free(__path);
  if (-1 < iVar1) {
    (*reply->vt->reply_ok)(reply);
    return;
  }
  uss_error((UnixSftpServer *)reply,reply_00);
  return;
}

Assistant:

static void uss_rmdir(SftpServer *srv, SftpReplyBuilder *reply, ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *pathstr = mkstr(path);
    int status = rmdir(pathstr);
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}